

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml-parser.c
# Opt level: O1

int coda_xml_parse(coda_xml_product *product)

{
  long lVar1;
  coda_product_definition *pcVar2;
  coda_product *pcVar3;
  int iVar4;
  XML_Status XVar5;
  XML_Error code;
  coda_type_record *pcVar6;
  __off_t _Var7;
  ssize_t sVar8;
  XML_LChar *pXVar9;
  XML_Index a;
  XML_Size XVar10;
  int *piVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  uint8_t *s;
  ulong uVar15;
  long lVar16;
  long __offset;
  long in_FS_OFFSET;
  bool bVar17;
  char byte_offset_str [21];
  parser_info_conflict info;
  char buff [8192];
  char local_2498 [24];
  parser_info_conflict local_2480;
  uint8_t local_2038 [8200];
  
  local_2480.parser = (XML_Parser)0x0;
  local_2480.abort_parser = 0;
  local_2480.product = (coda_xml_product *)0x0;
  local_2480.depth = -1;
  local_2480.attributes = (coda_dynamic_type *)0x0;
  local_2480.update_definition = 0;
  local_2480.value_length = 0;
  local_2480.value_size = 0;
  local_2480.value = (char *)0x0;
  local_2480.parser = coda_XML_ParserCreateNS((XML_Char *)0x0,' ');
  if (local_2480.parser == (XML_Parser)0x0) {
    coda_set_error(-0xe,"could not create XML parser");
    return -1;
  }
  pcVar2 = product->product_definition;
  local_2480.product = product;
  if (pcVar2 == (coda_product_definition *)0x0) {
    local_2480.update_definition = 1;
  }
  else {
    bVar17 = pcVar2->root_type == (coda_type *)0x0;
    local_2480.update_definition = (int)bVar17;
    if (!bVar17) {
      pcVar6 = (coda_type_record *)pcVar2->root_type;
      if (pcVar6->type_class != coda_record_class) {
        __assert_fail("product->product_definition->root_type->type_class == coda_record_class",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x30f,"int coda_xml_parse(coda_xml_product *)");
      }
      if (pcVar6->is_union != 0) {
        __assert_fail("!((coda_type_record *)product->product_definition->root_type)->is_union",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x310,"int coda_xml_parse(coda_xml_product *)");
      }
      local_2480.record[0] = coda_mem_record_new(pcVar6,(coda_dynamic_type *)0x0);
      goto LAB_0016cbb6;
    }
  }
  pcVar6 = coda_type_record_new(coda_format_xml);
  if (pcVar6 == (coda_type_record *)0x0) {
    coda_XML_ParserFree(local_2480.parser);
    return -1;
  }
  local_2480.record[0] = coda_mem_record_new(pcVar6,(coda_dynamic_type *)0x0);
  coda_type_release((coda_type *)pcVar6);
LAB_0016cbb6:
  if (local_2480.record[0] != (coda_mem_record *)0x0) {
    local_2480.definition[0] = (coda_type **)&local_2480.record[0]->definition;
    local_2480.index[0] = -1;
    local_2480.xml_name[0] = (char *)0x0;
    local_2480.depth = 0;
    coda_XML_SetUserData(local_2480.parser,&local_2480);
    coda_XML_SetParamEntityParsing(local_2480.parser,XML_PARAM_ENTITY_PARSING_ALWAYS);
    coda_XML_SetElementHandler(local_2480.parser,start_element_handler,end_element_handler);
    coda_XML_SetCharacterDataHandler(local_2480.parser,character_data_handler);
    coda_XML_SetNotStandaloneHandler(local_2480.parser,not_standalone_handler);
    uVar15 = product->raw_product->file_size;
    uVar13 = uVar15 + 0x1fff;
    if (-1 < (long)uVar15) {
      uVar13 = uVar15;
    }
    uVar15 = (ulong)((long)(uVar13 & 0xffffffffffffe000) < (long)uVar15);
    lVar16 = uVar15 + ((long)uVar13 >> 0xd);
    if (lVar16 != 0 && SCARRY8(uVar15,(long)uVar13 >> 0xd) == lVar16 < 0) {
      lVar1 = lVar16 + -1;
      __offset = 0;
      lVar14 = 0;
      do {
        pcVar3 = product->raw_product;
        if (*(int *)&pcVar3[1].filename == 0) {
          _Var7 = lseek(*(int *)((long)&pcVar3[1].filename + 4),__offset,0);
          if (_Var7 < 0) {
            coda_str64(__offset,local_2498);
            piVar11 = __errno_location();
            pcVar12 = strerror(*piVar11);
            coda_set_error(-0x16,"could not move to byte position %s (%s)",local_2498,pcVar12);
            goto LAB_0016ce55;
          }
          s = local_2038;
          sVar8 = read(*(int *)((long)&product->raw_product[1].filename + 4),s,0x2000);
          iVar4 = (int)sVar8;
          if (iVar4 < 0) {
            piVar11 = __errno_location();
            pcVar12 = strerror(*piVar11);
            coda_set_error(-0x16,"could not read from file (%s)",pcVar12);
            goto LAB_0016ce55;
          }
        }
        else {
          iVar4 = 0x2000;
          if (lVar1 <= lVar14) {
            iVar4 = (int)pcVar3->file_size + (int)lVar1 * -0x2000;
          }
          s = pcVar3->mem_ptr + __offset;
        }
        *(undefined4 *)(in_FS_OFFSET + -0x11f0) = 0;
        XVar5 = coda_XML_Parse(local_2480.parser,(char *)s,iVar4,(uint)(lVar1 == lVar14));
        if ((XVar5 == XML_STATUS_ERROR) || (*(int *)(in_FS_OFFSET + -0x11f0) != 0)) {
          if (*(int *)(in_FS_OFFSET + -0x11f0) == 0) {
            code = coda_XML_GetErrorCode(local_2480.parser);
            pXVar9 = coda_XML_ErrorString(code);
            coda_set_error(-0xe,"xml parse error: %s",pXVar9);
          }
          a = coda_XML_GetCurrentByteIndex(local_2480.parser);
          coda_str64(a,local_2498);
          XVar10 = coda_XML_GetCurrentLineNumber(local_2480.parser);
          coda_add_error_message(" (line: %lu, byte offset: %s)",XVar10,local_2498);
          goto LAB_0016ce55;
        }
        lVar14 = lVar14 + 1;
        __offset = __offset + 0x2000;
      } while (lVar16 != lVar14);
    }
    coda_XML_ParserFree(local_2480.parser);
    local_2480.parser = (XML_Parser)0x0;
    if ((local_2480.update_definition == 0) ||
       (iVar4 = coda_mem_type_update
                          ((coda_dynamic_type **)local_2480.record,
                           (coda_type *)local_2480.record[0]->definition), iVar4 == 0)) {
      product->root_type = (coda_dynamic_type *)local_2480.record[0];
      local_2480.depth = -1;
      parser_info_cleanup(&local_2480);
      return 0;
    }
  }
LAB_0016ce55:
  parser_info_cleanup(&local_2480);
  return -1;
}

Assistant:

int coda_xml_parse(coda_xml_product *product)
{
    char buff[BUFFSIZE];
    parser_info info;
    long num_blocks;
    long i;

    parser_info_init(&info);
    info.parser = XML_ParserCreateNS(NULL, ' ');
    if (info.parser == NULL)
    {
        coda_set_error(CODA_ERROR_XML, "could not create XML parser");
        return -1;
    }
    info.product = product;
    info.update_definition = (product->product_definition == NULL || product->product_definition->root_type == NULL);
    /* the root of the product is always a record, which will contain the top-level xml element as a field */
    if (info.update_definition)
    {
        coda_type_record *definition;

        definition = coda_type_record_new(coda_format_xml);
        if (definition == NULL)
        {
            XML_ParserFree(info.parser);
            return -1;
        }
        info.record[0] = coda_mem_record_new(definition, NULL);
        coda_type_release((coda_type *)definition);
    }
    else
    {
        assert(product->product_definition->root_type->type_class == coda_record_class);
        assert(!((coda_type_record *)product->product_definition->root_type)->is_union);
        info.record[0] = coda_mem_record_new((coda_type_record *)product->product_definition->root_type, NULL);
    }
    if (info.record[0] == NULL)
    {
        parser_info_cleanup(&info);
        return -1;
    }
    info.definition[0] = (coda_type **)&info.record[0]->definition;
    info.index[0] = -1;
    info.xml_name[0] = NULL;
    info.depth = 0;

    XML_SetUserData(info.parser, &info);
    XML_SetParamEntityParsing(info.parser, XML_PARAM_ENTITY_PARSING_ALWAYS);
    XML_SetElementHandler(info.parser, start_element_handler, end_element_handler);
    XML_SetCharacterDataHandler(info.parser, character_data_handler);
    XML_SetNotStandaloneHandler(info.parser, not_standalone_handler);

    /* we also need to parse in blocks for mmap-ed files since the file size may exceed MAX_INT */
    num_blocks = (long)(product->raw_product->file_size / BUFFSIZE);
    if (product->raw_product->file_size > num_blocks * BUFFSIZE)
    {
        num_blocks++;
    }
    for (i = 0; i < num_blocks; i++)
    {
        const char *buff_ptr;
        int length;
        int result;

        if (((coda_bin_product *)product->raw_product)->use_mmap)
        {
            if (i < num_blocks - 1)
            {
                length = BUFFSIZE;
            }
            else
            {
                length = (int)(product->raw_product->file_size - (num_blocks - 1) * BUFFSIZE);
            }
            buff_ptr = (const char *)&(product->raw_product->mem_ptr[i * BUFFSIZE]);
        }
        else
        {
            if (lseek(((coda_bin_product *)product->raw_product)->fd, (off_t)i * BUFFSIZE, SEEK_SET) < 0)
            {
                char byte_offset_str[21];

                coda_str64(i * BUFFSIZE, byte_offset_str);
                coda_set_error(CODA_ERROR_FILE_READ, "could not move to byte position %s (%s)", byte_offset_str,
                               strerror(errno));
                parser_info_cleanup(&info);
                return -1;
            }
            length = read(((coda_bin_product *)product->raw_product)->fd, buff, BUFFSIZE);
            if (length < 0)
            {
                coda_set_error(CODA_ERROR_FILE_READ, "could not read from file (%s)", strerror(errno));
                parser_info_cleanup(&info);
                return -1;
            }
            buff_ptr = buff;
        }

        coda_errno = 0;
        result = XML_Parse(info.parser, buff_ptr, length, (i == num_blocks - 1));
        if (result == XML_STATUS_ERROR || coda_errno != 0)
        {
            char s[21];

            if (coda_errno == 0)
            {
                coda_set_error(CODA_ERROR_XML, "xml parse error: %s", XML_ErrorString(XML_GetErrorCode(info.parser)));
            }
            coda_str64(XML_GetCurrentByteIndex(info.parser), s);
            coda_add_error_message(" (line: %lu, byte offset: %s)", (long)XML_GetCurrentLineNumber(info.parser), s);
            parser_info_cleanup(&info);
            return -1;
        }
    }

    XML_ParserFree(info.parser);
    info.parser = NULL;

    if (info.update_definition)
    {
        if (coda_mem_type_update((coda_dynamic_type **)&info.record[0], (coda_type *)info.record[0]->definition) != 0)
        {
            parser_info_cleanup(&info);
            return -1;
        }
    }

    product->root_type = (coda_dynamic_type *)info.record[0];
    info.depth = -1;

    parser_info_cleanup(&info);

    return 0;
}